

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_EB_STL_utils.cpp
# Opt level: O0

void __thiscall
amrex::STLtools::updateIntercept
          (STLtools *this,Array<Array4<Real>,_3> *inter_arr,
          Array<Array4<const_EB2::Type_t>,_3> *type_arr,Array4<const_double> *lst,Geometry *geom)

{
  void *in_RCX;
  CoordSys *in_R8;
  Box bx;
  Array4<const_unsigned_int> *type;
  Array4<double> *inter;
  int idim;
  GpuArray<double,_3U> *problo;
  GpuArray<double,_3U> *dx;
  Array4<double> *in_stack_fffffffffffffe68;
  Box *in_stack_fffffffffffffe70;
  Geometry *in_stack_fffffffffffffe80;
  undefined1 auStack_158 [16];
  anon_class_248_6_cdbc804f *in_stack_fffffffffffffeb8;
  Box *in_stack_fffffffffffffec0;
  undefined1 auStack_110 [64];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  const_reference local_80;
  const_reference local_78;
  int local_6c;
  undefined8 local_68 [3];
  undefined8 *local_50;
  GpuArray<double,_3U> local_48;
  GpuArray<double,_3U> *local_30;
  void *local_20;
  
  local_20 = in_RCX;
  CoordSys::CellSizeArray(&local_48,in_R8);
  local_30 = &local_48;
  Geometry::ProbLoArray(in_stack_fffffffffffffe80);
  local_50 = local_68;
  for (local_6c = 0; local_6c < 3; local_6c = local_6c + 1) {
    local_78 = std::array<amrex::Array4<double>,_3UL>::operator[]
                         ((array<amrex::Array4<double>,_3UL> *)in_stack_fffffffffffffe70,
                          (size_type)in_stack_fffffffffffffe68);
    local_80 = std::array<amrex::Array4<const_unsigned_int>,_3UL>::operator[]
                         ((array<amrex::Array4<const_unsigned_int>,_3UL> *)in_stack_fffffffffffffe70
                          ,(size_type)in_stack_fffffffffffffe68);
    Box::Box<double>(in_stack_fffffffffffffe70,in_stack_fffffffffffffe68);
    memcpy(&stack0xfffffffffffffe68,local_80,0x3c);
    memcpy(auStack_158,local_78,0x3c);
    memcpy(auStack_110,local_20,0x3c);
    local_d0 = *local_50;
    local_c8 = local_50[1];
    local_c0 = local_50[2];
    local_b8 = local_30->arr[0];
    local_b0 = local_30->arr[1];
    local_a8 = local_30->arr[2];
    ParallelFor<amrex::STLtools::updateIntercept(std::array<amrex::Array4<double>,3ul>const&,std::array<amrex::Array4<unsigned_int_const>,3ul>const&,amrex::Array4<double_const>const&,amrex::Geometry_const&)const::__0>
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8);
  }
  return;
}

Assistant:

void
STLtools::updateIntercept (Array<Array4<Real>,AMREX_SPACEDIM> const& inter_arr,
                           Array<Array4<EB2::Type_t const>,AMREX_SPACEDIM> const& type_arr,
                           Array4<Real const> const& lst, Geometry const& geom) const
{
    auto const& dx = geom.CellSizeArray();
    auto const& problo = geom.ProbLoArray();
    for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
        Array4<Real> const& inter = inter_arr[idim];
        Array4<EB2::Type_t const> const& type = type_arr[idim];
        const Box bx{inter};
        amrex::ParallelFor(bx, [=] AMREX_GPU_DEVICE (int i, int j, int k)
        {
            if (type(i,j,k) == EB2::Type::irregular) {
                bool is_nan = amrex::isnan(inter(i,j,k));
                if (idim == 0) {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        // interp might still be quiet_nan because lst that
                        // was set to zero has been changed by FillBoundary
                        // at periodic bounadries.
                        inter(i,j,k) = problo[0] + i*dx[0];
                    }
                    else if (lst(i+1,j,k) == Real(0.0) ||
                             (lst(i+1,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[0] + (i+1)*dx[0];
                    }
                } else if (idim == 1) {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[1] + j*dx[1];
                    }
                    else if (lst(i,j+1,k) == Real(0.0) ||
                             (lst(i,j+1,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[1] + (j+1)*dx[1];
                    }
                } else {
                    if (lst(i,j,k) == Real(0.0) ||
                        (lst(i,j,k) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[2] + k*dx[2];
                        }
                    else if (lst(i,j,k+1) == Real(0.0) ||
                             (lst(i,j,k+1) > Real(0.0) && is_nan))
                    {
                        inter(i,j,k) = problo[2] + (k+1)*dx[2];
                    }
                }
            }
        });
    }
}